

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::SubpassDependency::SubpassDependency
          (SubpassDependency *this,deUint32 _srcSubpass,deUint32 _dstSubpass,
          VkPipelineStageFlags _srcStageMask,VkPipelineStageFlags _dstStageMask,
          VkAccessFlags _srcAccessMask,VkAccessFlags _dstAccessMask,
          VkDependencyFlags _dependencyFlags)

{
  (this->super_VkSubpassDependency).srcSubpass = _srcSubpass;
  (this->super_VkSubpassDependency).dstSubpass = _dstSubpass;
  (this->super_VkSubpassDependency).srcStageMask = _srcStageMask;
  (this->super_VkSubpassDependency).dstStageMask = _dstStageMask;
  (this->super_VkSubpassDependency).srcAccessMask = _srcAccessMask;
  (this->super_VkSubpassDependency).dstAccessMask = _dstAccessMask;
  (this->super_VkSubpassDependency).dependencyFlags = _dependencyFlags;
  return;
}

Assistant:

SubpassDependency::SubpassDependency (deUint32					_srcSubpass,
									  deUint32					_dstSubpass,
									  vk::VkPipelineStageFlags	_srcStageMask,
									  vk::VkPipelineStageFlags	_dstStageMask,
									  vk::VkAccessFlags			_srcAccessMask,
									  vk::VkAccessFlags			_dstAccessMask,
									  vk::VkDependencyFlags		_dependencyFlags)
{
	srcSubpass		= _srcSubpass;
	dstSubpass		= _dstSubpass;
	srcStageMask	= _srcStageMask;
	dstStageMask	= _dstStageMask;
	srcAccessMask	= _srcAccessMask;
	dstAccessMask	= _dstAccessMask;
	dependencyFlags	= _dependencyFlags;
}